

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

void AddCoins(CCoinsViewCache *cache,CTransaction *tx,int nHeight,bool check_for_overwrite)

{
  bool fCoinBaseIn;
  undefined1 possible_overwrite;
  long lVar2;
  pointer pCVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  Coin local_98;
  COutPoint local_68;
  long local_38;
  int iVar1;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  fCoinBaseIn = CTransaction::IsCoinBase(tx);
  lVar2 = 0;
  uVar4 = 0;
  while( true ) {
    pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar3) / 0x28) <= uVar4) break;
    possible_overwrite = fCoinBaseIn;
    if (check_for_overwrite) {
      local_98.out.nValue._0_4_ =
           *(undefined4 *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_98.out.nValue._4_4_ =
           *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
      local_98.out.scriptPubKey.super_CScriptBase._union._0_4_ =
           *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      local_98.out.scriptPubKey.super_CScriptBase._union._4_4_ =
           *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
      local_98.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity =
           *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_98.out.scriptPubKey.super_CScriptBase._union._12_4_ =
           *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14);
      local_98.out.scriptPubKey.super_CScriptBase._union._16_4_ =
           *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_98.out.scriptPubKey.super_CScriptBase._union._20_4_ =
           *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c);
      local_98.out.scriptPubKey.super_CScriptBase._union._24_4_ = (uint32_t)uVar4;
      iVar1 = (*(cache->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                        (cache,&local_98);
      possible_overwrite = (undefined1)iVar1;
      pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    local_68.n = (uint32_t)uVar4;
    Coin::Coin(&local_98,(CTxOut *)((long)&pCVar3->nValue + lVar2),nHeight,fCoinBaseIn);
    CCoinsViewCache::AddCoin(cache,&local_68,&local_98,(bool)possible_overwrite);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&local_98.out.scriptPubKey.super_CScriptBase);
    uVar4 = uVar4 + 1;
    lVar2 = lVar2 + 0x28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddCoins(CCoinsViewCache& cache, const CTransaction &tx, int nHeight, bool check_for_overwrite) {
    bool fCoinbase = tx.IsCoinBase();
    const Txid& txid = tx.GetHash();
    for (size_t i = 0; i < tx.vout.size(); ++i) {
        bool overwrite = check_for_overwrite ? cache.HaveCoin(COutPoint(txid, i)) : fCoinbase;
        // Coinbase transactions can always be overwritten, in order to correctly
        // deal with the pre-BIP30 occurrences of duplicate coinbase transactions.
        cache.AddCoin(COutPoint(txid, i), Coin(tx.vout[i], nHeight, fCoinbase), overwrite);
    }
}